

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer_sample.cc
# Opt level: O0

int anon_unknown.dwarf_196d::ParseArgWebVTT
              (char **argv,int *argv_index,int argc_check,metadata_files_t *metadata_files)

{
  int iVar1;
  undefined1 local_a8 [8];
  MetadataFile f;
  Arg *arg;
  int idx;
  Arg args [5];
  int *i;
  metadata_files_t *metadata_files_local;
  int argc_check_local;
  int *argv_index_local;
  char **argv_local;
  
  args[4]._8_8_ = argv_index;
  memcpy(&stack0xffffffffffffff78,&PTR_anon_var_dwarf_77b_0017a7c0,0x50);
  arg._4_4_ = 0;
  while( true ) {
    if (4 < arg._4_4_) {
      return 0;
    }
    f._8_8_ = &stack0xffffffffffffff78 + (long)arg._4_4_ * 0x10;
    iVar1 = strcmp(*(char **)f._8_8_,argv[*(int *)args[4]._8_8_]);
    if (iVar1 == 0) break;
    arg._4_4_ = arg._4_4_ + 1;
  }
  *(int *)args[4]._8_8_ = *(int *)args[4]._8_8_ + 1;
  if (argc_check < *(int *)args[4]._8_8_) {
    printf("missing value for %s\n",*(undefined8 *)f._8_8_);
    return -1;
  }
  local_a8 = (undefined1  [8])argv[*(int *)args[4]._8_8_];
  f.name._0_4_ = *(undefined4 *)(f._8_8_ + 8);
  std::__cxx11::
  list<(anonymous_namespace)::MetadataFile,_std::allocator<(anonymous_namespace)::MetadataFile>_>::
  push_back(metadata_files,(value_type *)local_a8);
  return 1;
}

Assistant:

int ParseArgWebVTT(char* argv[], int* argv_index, int argc_check,
                   metadata_files_t* metadata_files) {
  int& i = *argv_index;

  enum { kCount = 5 };
  struct Arg {
    const char* name;
    SampleMuxerMetadata::Kind kind;
  };
  const Arg args[kCount] = {
      {"-webvtt-subtitles", SampleMuxerMetadata::kSubtitles},
      {"-webvtt-captions", SampleMuxerMetadata::kCaptions},
      {"-webvtt-descriptions", SampleMuxerMetadata::kDescriptions},
      {"-webvtt-metadata", SampleMuxerMetadata::kMetadata},
      {"-webvtt-chapters", SampleMuxerMetadata::kChapters}};

  for (int idx = 0; idx < kCount; ++idx) {
    const Arg& arg = args[idx];

    if (strcmp(arg.name, argv[i]) != 0)  // no match
      continue;

    ++i;  // consume arg name here

    if (i > argc_check) {
      printf("missing value for %s\n", arg.name);
      return -1;  // error
    }

    MetadataFile f;
    f.name = argv[i];  // arg value is consumed via caller's loop idx
    f.kind = arg.kind;

    metadata_files->push_back(f);
    return 1;  // successfully parsed WebVTT arg
  }

  return 0;  // not a WebVTT arg
}